

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf278b.c
# Opt level: O3

void ymf278b_pcm_update(void *info,UINT32 samples,DEV_SMPL **outputs)

{
  size_t __n;
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  INT16 IVar5;
  INT16 IVar6;
  long lVar7;
  byte bVar8;
  UINT16 pos;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ushort uVar12;
  short sVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  char cVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  YMF278BSlot *slot;
  ulong local_58;
  
  __n = (ulong)samples * 4;
  memset(*outputs,0,__n);
  memset(outputs[1],0,__n);
  lVar7 = 0x4f;
  while (*(char *)((long)info + lVar7) == '\0') {
    lVar7 = lVar7 + 0x34;
    if (lVar7 == 0x52f) {
      return;
    }
  }
  if (samples == 0) {
    return;
  }
  iVar2 = mix_level[*(int *)((long)info + 0x518)];
  iVar3 = mix_level[*(int *)((long)info + 0x51c)];
  local_58 = 0;
  do {
    lVar7 = 0;
    do {
      if ((*(char *)((long)info + lVar7 + 0x4f) != '\0') &&
         (*(char *)((long)info + lVar7 + 0x51) == '\0')) {
        slot = (YMF278BSlot *)((long)info + lVar7 + 0x20);
        iVar19 = *(int *)((long)info + lVar7 + 0x30);
        IVar5 = ymf278b_getSample((YMF278BChip *)info,slot,(UINT16)iVar19);
        pos = (UINT16)(iVar19 + 1U);
        uVar14 = (uint)*(ushort *)((long)info + lVar7 + 0x26);
        uVar9 = (iVar19 + 1U & 0xffff) + uVar14;
        if (0xffff < uVar9) {
          pos = (short)uVar9 + *(short *)((long)info + lVar7 + 0x24);
        }
        iVar15 = *(int *)((long)info + lVar7 + 0x2c);
        IVar6 = ymf278b_getSample((YMF278BChip *)info,slot,pos);
        uVar12 = *(ushort *)((long)info + lVar7 + 0x32);
        uVar9 = (uint)uVar12;
        cVar17 = *(char *)((long)info + lVar7 + 0x50);
        if ((cVar17 != '\0') && (uVar11 = (ulong)*(byte *)((long)info + lVar7 + 0x48), uVar11 != 0))
        {
          uVar9 = *(uint *)((long)info + lVar7 + 0x34);
          uVar18 = uVar9 >> 10;
          uVar10 = uVar18 & 0xff7f ^ 0x7f;
          if ((uVar9 >> 0x11 & 1) == 0) {
            uVar10 = uVar18;
          }
          uVar9 = (uint)uVar12 + ((uint)""[uVar11] * (uVar10 & 0xffff) >> 7);
        }
        if (0x27f < (uVar9 & 0xffff)) {
          uVar9 = 0x280;
        }
        bVar8 = *(byte *)((long)info + lVar7 + 0x43);
        iVar4 = pan_right[bVar8];
        iVar15 = (((IVar6 * iVar15 + (0x10000 - iVar15) * (int)IVar5 >> 0x10) *
                   vol_tab[(ulong)uVar9 & 0xffff] >> 0xf) *
                  vol_tab[(ulong)*(byte *)((long)info + lVar7 + 0x42) * 4] >> 0xf) * 0x5a82 >> 0x11;
        (*outputs)[local_58] =
             (*outputs)[local_58] +
             ((int)((0x20 - (pan_left[bVar8] + iVar2 & 0xfU) >>
                    ((byte)((uint)(pan_left[bVar8] + iVar2) >> 4) & 0x1f)) * iVar15) >> 5);
        outputs[1][local_58] =
             outputs[1][local_58] +
             ((int)(iVar15 * (0x20 - (iVar4 + iVar3 & 0xfU) >>
                             ((byte)((uint)(iVar4 + iVar3) >> 4) & 0x1f))) >> 5);
        if ((cVar17 == '\0') || (uVar11 = (ulong)*(byte *)((long)info + lVar7 + 0x47), uVar11 == 0))
        {
          uVar9 = *(uint *)((long)info + lVar7 + 0x28);
        }
        else {
          cVar17 = *(char *)((long)info + lVar7 + 0x3e);
          uVar9 = 0;
          if (cVar17 != -8) {
            uVar9 = *(uint *)((long)info + lVar7 + 0x34);
            uVar18 = uVar9 >> 0xc;
            uVar10 = uVar18 & 0xffffffef ^ 0xf;
            if ((uVar9 >> 0x10 & 1) == 0) {
              uVar10 = uVar18;
            }
            uVar12 = -((ushort)uVar10 & 0xf);
            if ((uVar10 & 0x20) == 0) {
              uVar12 = (ushort)uVar10;
            }
            iVar15 = (int)(short)uVar12 * (int)vib_depth[uVar11];
            uVar9 = ((int)(short)((short)((uint)(iVar15 / 6 + (iVar15 >> 0x1f)) >> 1) -
                                 (short)(iVar15 >> 0x1f)) +
                     (uint)*(ushort *)((long)info + lVar7 + 0x3c) + 0x400 << (cVar17 + 8U & 0x1f))
                    >> 3;
          }
        }
        uVar9 = uVar9 + *(int *)((long)info + lVar7 + 0x2c);
        *(uint *)((long)info + lVar7 + 0x2c) = uVar9;
        if (0xffff < uVar9) {
          uVar10 = (uVar9 >> 0x10) + iVar19;
          sVar13 = (short)uVar10;
          uVar14 = (uVar10 & 0xffff) + uVar14;
          if (0xffff < uVar14) {
            sVar13 = (short)uVar14 + *(short *)((long)info + lVar7 + 0x24);
          }
          *(short *)((long)info + lVar7 + 0x30) = sVar13;
          *(uint *)((long)info + lVar7 + 0x2c) = uVar9 & 0xffff;
        }
      }
      lVar7 = lVar7 + 0x34;
    } while (lVar7 != 0x4e0);
    iVar19 = *(int *)((long)info + 0x504);
    uVar9 = iVar19 + 1;
    *(uint *)((long)info + 0x504) = uVar9;
    if (8 < uVar9) {
      uVar9 = iVar19 - 8;
      *(uint *)((long)info + 0x504) = uVar9;
      cVar17 = *(char *)((long)info + 0x508);
      bVar8 = cVar17 + 1;
      *(byte *)((long)info + 0x508) = bVar8;
      if (2 < bVar8) {
        *(char *)((long)info + 0x508) = cVar17 + -2;
      }
    }
    uVar14 = *(int *)((long)info + 0x500) + 1;
    *(uint *)((long)info + 0x500) = uVar14;
    lVar7 = 0;
    lVar16 = 0;
    do {
      if (uVar9 == 0) {
        bVar8 = *(byte *)((long)info + lVar7 + 0x41);
        bVar1 = *(byte *)((long)info + lVar7 + 0x42);
        if (*(char *)((long)info + 0x508) == '\0') {
          cVar17 = '\x01';
          if (bVar1 < bVar8) goto LAB_00154f6a;
        }
        else {
          cVar17 = -1;
          if (bVar8 < bVar1) {
LAB_00154f6a:
            *(byte *)((long)info + lVar7 + 0x42) = cVar17 + bVar1;
          }
        }
      }
      if (*(char *)((long)info + lVar7 + 0x50) != '\0') {
        *(UINT32 *)((long)info + lVar7 + 0x34) =
             *(int *)((long)info + lVar7 + 0x34) + lfo_period[*(byte *)((long)info + lVar7 + 0x46)]
             & 0x3ffff;
      }
      uVar10 = (uint)*(byte *)((long)info + lVar7 + 0x4f);
      if (3 < uVar10 - 1) goto LAB_00155251;
      lVar20 = lVar16 * 0x34;
      switch(uVar10) {
      case 1:
        if (*(char *)((long)info + lVar7 + 0x45) != '\0') goto LAB_001550ec;
        bVar8 = *(byte *)((long)info + lVar7 + 0x4d);
LAB_001551c2:
        uVar10 = (uint)bVar8;
        if ((*(char *)((long)info + lVar7 + 0x3f) == '\0') ||
           (uVar11 = 0x14, *(short *)((long)info + lVar7 + 0x32) < 0xc0)) {
          if (uVar10 == 0) {
            uVar11 = 0;
            break;
          }
          if (uVar10 != 0xf) {
            uVar10 = uVar10 << 2;
            uVar18 = (uint)*(byte *)((long)info + lVar7 + 0x4c);
            if (uVar18 != 0xf) {
              iVar15 = (int)*(char *)((long)info + lVar7 + 0x3e) + uVar18;
              iVar19 = 0xf;
              if (iVar15 < 0xf) {
                iVar19 = iVar15;
              }
              iVar19 = iVar19 * 2;
              if (iVar15 < 0) {
                iVar19 = 0;
              }
              uVar10 = (uVar10 | *(uint *)((long)info + lVar7 + 0x3c) >> 9 & 1) + iVar19;
            }
            if (0x3e < (int)uVar10) {
              uVar10 = 0x3f;
            }
            uVar11 = (ulong)(uVar10 & 0xff);
            break;
          }
          goto LAB_001551ea;
        }
        break;
      case 2:
        if (*(char *)((long)info + lVar7 + 0x45) == '\0') {
          bVar8 = *(byte *)((long)info + lVar7 + 0x4b);
          goto LAB_001551c2;
        }
LAB_001550ec:
        uVar11 = 0x30;
        if (0x7f < *(short *)((long)info + lVar7 + 0x32)) {
LAB_001551ea:
          uVar11 = 0x3f;
        }
        break;
      case 3:
        if (*(char *)((long)info + lVar7 + 0x45) == '\0') {
          bVar8 = *(byte *)((long)info + lVar7 + 0x4a);
          if ((*(char *)((long)info + lVar7 + 0x3f) == '\0') ||
             (uVar11 = 0x14, *(short *)((long)info + lVar7 + 0x32) < 0xc0)) {
            if (bVar8 == 0) {
              uVar11 = (ulong)(uint)bVar8;
            }
            else {
              if (bVar8 == 0xf) goto LAB_00155143;
              uVar11 = (ulong)bVar8 << 2;
              uVar10 = (uint)*(byte *)((long)info + lVar7 + 0x4c);
              if (uVar10 != 0xf) {
                iVar15 = (int)*(char *)((long)info + lVar7 + 0x3e) + uVar10;
                iVar19 = 0xf;
                if (iVar15 < 0xf) {
                  iVar19 = iVar15;
                }
                iVar19 = iVar19 * 2;
                if (iVar15 < 0) {
                  iVar19 = 0;
                }
                uVar11 = (ulong)(((uint)uVar11 | *(uint *)((long)info + lVar7 + 0x3c) >> 9 & 1) +
                                iVar19);
              }
              if (0x3e < (int)uVar11) {
                uVar11 = 0x3f;
              }
              uVar11 = uVar11 & 0xff;
            }
          }
        }
        else {
          uVar11 = 0x30;
          if (0x7f < *(short *)((long)info + lVar7 + 0x32)) {
LAB_00155143:
            uVar11 = 0x3f;
          }
        }
        if ((uVar14 & ~(-1 << ("\f\f\f\f\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                               [uVar11] & 0x1f))) == 0) {
          sVar13 = (ushort)""[(ulong)(uVar14 >> ("\f\f\f\f\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                                                 [uVar11] & 0x1f) & 7) + (ulong)"pppp"[uVar11]] +
                   *(short *)((long)info + lVar7 + 0x32);
          *(short *)((long)info + lVar7 + 0x32) = sVar13;
          if ((sVar13 < *(short *)((long)info + lVar7 + 0x38)) ||
             (*(undefined1 *)((long)info + lVar7 + 0x4f) = 2, lVar20 = lVar7, sVar13 < 0x280))
          goto LAB_00155251;
          goto LAB_00155244;
        }
        goto LAB_00155251;
      case 4:
        bVar8 = *(byte *)((long)info + lVar7 + 0x49);
        uVar11 = (ulong)bVar8;
        if (bVar8 != 0) {
          if (bVar8 != 0xf) {
            uVar11 = (ulong)bVar8 << 2;
            uVar10 = (uint)*(byte *)((long)info + lVar7 + 0x4c);
            if (uVar10 != 0xf) {
              iVar15 = (int)*(char *)((long)info + lVar7 + 0x3e) + uVar10;
              iVar19 = 0xf;
              if (iVar15 < 0xf) {
                iVar19 = iVar15;
              }
              iVar19 = iVar19 * 2;
              if (iVar15 < 0) {
                iVar19 = 0;
              }
              uVar11 = (ulong)(((uint)uVar11 | *(uint *)((long)info + lVar7 + 0x3c) >> 9 & 1) +
                              iVar19);
            }
            if (0x3e < (int)uVar11) {
              uVar11 = 0x3f;
            }
            if ((byte)uVar11 < 0x3f) goto LAB_00155061;
          }
          goto LAB_00155251;
        }
LAB_00155061:
        if (((uVar14 & ~(-1 << ("\f\f\f\f\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                                [uVar11 & 0xff] & 0x1f))) != 0) ||
           (sVar13 = *(short *)((long)info + lVar7 + 0x32),
           sVar13 = (short)((uint)""[(ulong)(uVar14 >> (
                                                  "\f\f\f\f\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                                                  [uVar11 & 0xff] & 0x1f) & 7) +
                                     (ulong)"pppp"[uVar11 & 0xff]] * ~(int)sVar13 >> 4) + sVar13,
           *(short *)((long)info + lVar7 + 0x32) = sVar13, 0 < sVar13)) goto LAB_00155251;
        *(undefined2 *)((long)info + lVar7 + 0x32) = 0;
        bVar8 = 0 < *(short *)((long)info + lVar7 + 0x38) | 2;
        goto LAB_0015524c;
      }
      if (((uVar14 & ~(-1 << ("\f\f\f\f\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                              [uVar11] & 0x1f))) == 0) &&
         (sVar13 = (ushort)""[(ulong)(uVar14 >> ("\f\f\f\f\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                                                 [uVar11] & 0x1f) & 7) + (ulong)"pppp"[uVar11]] +
                   *(short *)((long)info + lVar7 + 0x32),
         *(short *)((long)info + lVar7 + 0x32) = sVar13, 0x27f < sVar13)) {
LAB_00155244:
        *(undefined2 *)((long)info + lVar20 + 0x32) = 0x280;
        bVar8 = 0;
LAB_0015524c:
        *(byte *)((long)info + lVar7 + 0x4f) = bVar8;
      }
LAB_00155251:
      lVar16 = lVar16 + 1;
      lVar7 = lVar7 + 0x34;
    } while (lVar7 != 0x4e0);
    local_58 = local_58 + 1;
    if (local_58 == samples) {
      return;
    }
  } while( true );
}

Assistant:

static void ymf278b_pcm_update(void *info, UINT32 samples, DEV_SMPL** outputs)
{
	YMF278BChip* chip = (YMF278BChip *)info;
	int i;
	UINT32 j;
	INT32 vl;
	INT32 vr;
	
	memset(outputs[0], 0, samples * sizeof(DEV_SMPL));
	memset(outputs[1], 0, samples * sizeof(DEV_SMPL));
	
	if (! ymf278b_anyActive(chip))
	{
		// TODO update internal state, even if muted
		// TODO also mute individual channels
		return;
	}

	vl = mix_level[chip->pcm_l];
	vr = mix_level[chip->pcm_r];
	for (j = 0; j < samples; j ++)
	{
		for (i = 0; i < 24; i ++)
		{
			YMF278BSlot* sl;
			INT16 sample;
			INT32 smplOut;
			UINT16 envVol;
			INT32 volLeft;
			INT32 volRight;
			UINT32 step;
			
			sl = &chip->slots[i];
			if (sl->state == EG_OFF || sl->Muted)
			{
				//outputs[0][j] += 0;
				//outputs[1][j] += 0;
				continue;
			}

			sample = (ymf278b_getSample(chip, sl, sl->pos) * (0x10000 - sl->stepptr) +
			          ymf278b_getSample(chip, sl, ymf278b_nextPos(sl, sl->pos, 1)) * sl->stepptr) >> 16;
			
			// TL levels are 00..FF internally (TL register value 7F is mapped to TL level FF)
			// Envelope levels have 4x the resolution (000..3FF)
			// Volume levels are approximate logarithmic: -6 db result in half volume. Steps in between use linear interpolation.
			// A volume of -60 db or lower results in silence. (value 0x280..0x3FF).
			// Recordings from actual hardware indicate, that TL level and envelope level are applied separately.
			// Each of them is clipped to silence below -60 db, but TL+envelope might result in a lower volume. -Valley Bell
			envVol = (UINT16)sl->env_vol;
			if (sl->lfo_active && sl->AM)
				envVol += ymf278b_slot_compute_am(sl);
			if (envVol >= MAX_ATT_INDEX)
				envVol = MAX_ATT_INDEX;
			smplOut = (sample * vol_tab[envVol]) >> 15;
			smplOut = (smplOut * vol_tab[sl->TL << TL_SHIFT]) >> 15;

			// Panning is also done separately. (low-volume TL + low-volume panning goes below -60 db)
			// I'll be taking wild guess and assume that -3 db is approximated with 75%. (same as with TL and envelope levels)
			// The same applies to the PCM mix level.
			volLeft  = pan_left [sl->pan] + vl;
			volRight = pan_right[sl->pan] + vr;
			// 0 -> 0x20, 8 -> 0x18, 16 -> 0x10, 24 -> 0x0C, etc. (not using vol_tab here saves array boundary checks)
			volLeft  = (0x20 - (volLeft  & 0x0F)) >> (volLeft  >> 4);
			volRight = (0x20 - (volRight & 0x0F)) >> (volRight >> 4);
			
			smplOut = (smplOut * 0x5A82) >> 17;	// reduce volume by -15 db, should bring it into balance with FM
			outputs[0][j] += (smplOut * volLeft ) >> 5;
			outputs[1][j] += (smplOut * volRight) >> 5;

			step = (sl->lfo_active && sl->vib)
			     ? calcStep(sl->OCT, sl->FN, ymf278b_slot_compute_vib(sl))
			     : sl->step;
			sl->stepptr += step;

			if (sl->stepptr >= 0x10000)
			{
				sl->pos = ymf278b_nextPos(sl, sl->pos, sl->stepptr >> 16);
				sl->stepptr &= 0xFFFF;
			}
		}
		ymf278b_advance(chip);
	}
}